

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.cpp
# Opt level: O2

void __thiscall TextFile::~TextFile(TextFile *this)

{
  int in_ESI;
  
  close(this,in_ESI);
  std::__cxx11::string::~string((string *)&this->buf);
  std::__cxx11::string::~string((string *)&this->content);
  std::__cxx11::string::~string((string *)&this->errorText);
  ghc::filesystem::path::~path(&this->fileName);
  ghc::filesystem::basic_fstream<char,_std::char_traits<char>_>::~basic_fstream(&this->stream);
  return;
}

Assistant:

TextFile::~TextFile()
{
	close();
}